

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::test(FastText *this,istream *in,int32_t k)

{
  int iVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var2;
  ostream *poVar3;
  int iVar4;
  pointer ppVar5;
  vector<int,_std::allocator<int>_> labels;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> modelPredictions;
  vector<int,_std::allocator<int>_> line;
  int local_a4;
  _Vector_base<int,_std::allocator<int>_> local_98;
  double local_78;
  undefined8 uStack_70;
  _Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> local_68;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a4 = 0;
  local_78 = 0.0;
  uStack_70 = 0;
  iVar4 = 0;
  while( true ) {
    iVar1 = std::istream::peek();
    if (iVar1 == -1) break;
    Dictionary::getLine((this->dict_).
                        super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        in,(vector<int,_std::allocator<int>_> *)&local_48,
                        (vector<int,_std::allocator<int>_> *)&local_98,
                        &((this->model_).
                          super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         rng);
    Dictionary::addNgrams
              ((this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(vector<int,_std::allocator<int>_> *)&local_48,
               ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->wordNgrams);
    if ((local_98._M_impl.super__Vector_impl_data._M_finish !=
         local_98._M_impl.super__Vector_impl_data._M_start) &&
       (local_48._M_impl.super__Vector_impl_data._M_finish !=
        local_48._M_impl.super__Vector_impl_data._M_start)) {
      local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Model::predict((this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,(vector<int,_std::allocator<int>_> *)&local_48,k,
                     (vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                     &local_68);
      for (ppVar5 = local_68._M_impl.super__Vector_impl_data._M_start;
          ppVar5 != local_68._M_impl.super__Vector_impl_data._M_finish; ppVar5 = ppVar5 + 1) {
        _Var2 = std::
                __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                          (local_98._M_impl.super__Vector_impl_data._M_start,
                           local_98._M_impl.super__Vector_impl_data._M_finish,&ppVar5->second);
        local_78 = (double)((ulong)(_Var2._M_current ==
                                   local_98._M_impl.super__Vector_impl_data._M_finish) *
                            (long)local_78 +
                           (ulong)(_Var2._M_current !=
                                  local_98._M_impl.super__Vector_impl_data._M_finish) *
                           (long)(local_78 + 1.0));
        uStack_70 = 0;
      }
      iVar4 = iVar4 + 1;
      local_a4 = local_a4 +
                 (int)((ulong)((long)local_98._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_98._M_impl.super__Vector_impl_data._M_start) >> 2);
      std::_Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::
      ~_Vector_base(&local_68);
    }
  }
  *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 3;
  poVar3 = std::operator<<((ostream *)&std::cout,"P@");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,k);
  std::operator<<(poVar3,": ");
  poVar3 = std::ostream::_M_insert<double>(local_78 / (double)(iVar4 * k));
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"R@");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,k);
  std::operator<<(poVar3,": ");
  poVar3 = std::ostream::_M_insert<double>(local_78 / (double)local_a4);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Number of examples: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_98);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void FastText::test(std::istream& in, int32_t k) {
  int32_t nexamples = 0, nlabels = 0;
  double precision = 0.0;
  std::vector<int32_t> line, labels;

  while (in.peek() != EOF) {
    dict_->getLine(in, line, labels, model_->rng);
    dict_->addNgrams(line, args_->wordNgrams);
    if (labels.size() > 0 && line.size() > 0) {
      std::vector<std::pair<real, int32_t>> modelPredictions;
      model_->predict(line, k, modelPredictions);
      for (auto it = modelPredictions.cbegin(); it != modelPredictions.cend(); it++) {
        if (std::find(labels.begin(), labels.end(), it->second) != labels.end()) {
          precision += 1.0;
        }
      }
      nexamples++;
      nlabels += labels.size();
    }
  }
  std::cout << std::setprecision(3);
  std::cout << "P@" << k << ": " << precision / (k * nexamples) << std::endl;
  std::cout << "R@" << k << ": " << precision / nlabels << std::endl;
  std::cout << "Number of examples: " << nexamples << std::endl;
}